

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O0

RegSlot __thiscall
ByteCodeGenerator::EmitLdObjProto
          (ByteCodeGenerator *this,OpCode op,RegSlot objReg,FuncInfo *funcInfo)

{
  RegSlot R0;
  ByteCodeWriter *this_00;
  RegSlot protoReg;
  FuncInfo *funcInfo_local;
  RegSlot objReg_local;
  OpCode op_local;
  ByteCodeGenerator *this_local;
  
  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
  this_00 = Writer(this);
  Js::ByteCodeWriter::Reg2(this_00,op,R0,objReg);
  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  return R0;
}

Assistant:

Js::RegSlot EmitLdObjProto(Js::OpCode op, Js::RegSlot objReg, FuncInfo *funcInfo)
    {
        // LdHomeObjProto protoReg, objReg
        // LdFuncObjProto protoReg, objReg
        Js::RegSlot protoReg = funcInfo->AcquireTmpRegister();
        this->Writer()->Reg2(op, protoReg, objReg);
        funcInfo->ReleaseTmpRegister(protoReg);
        return protoReg;
    }